

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool __thiscall
slang::ast::Bitstream::checkClassAccess
          (Bitstream *this,Type *type,ASTContext *context,SourceRange sourceRange)

{
  bool bVar1;
  Type *pTVar2;
  Diagnostic *diag;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar3;
  SourceRange sourceRange_00;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> local_38;
  
  sourceRange_00.endLoc = sourceRange.startLoc;
  bVar1 = Type::isClass((Type *)this);
  if (bVar1) {
    pTVar2 = Type::getCanonicalType((Type *)this);
    sVar3 = Scope::membersOfType<slang::ast::ClassPropertySymbol>((Scope *)(pTVar2 + 1));
    local_38 = sVar3._M_begin.current;
    while (local_38.current != sVar3._M_end.current.current) {
      if (((*(int *)&local_38.current[5].location != 0) &&
          (*(int *)&local_38.current[5].name._M_str == 0)) &&
         (bVar1 = Lookup::isVisibleFrom(local_38.current,*(Scope **)&type->super_Symbol), !bVar1)) {
        sourceRange_00.startLoc = (SourceLocation)context;
        diag = ASTContext::addDiag((ASTContext *)type,(DiagCode)0x3d0007,sourceRange_00);
        ast::operator<<(diag,(Type *)this);
        return false;
      }
      Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::increment(&local_38);
    }
  }
  return true;
}

Assistant:

bool Bitstream::checkClassAccess(const Type& type, const ASTContext& context,
                                 SourceRange sourceRange) {
    if (!type.isClass())
        return true;

    auto& ct = type.getCanonicalType().as<ClassType>();
    for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
        if (prop.visibility != Visibility::Public && prop.lifetime == VariableLifetime::Automatic) {
            if (!Lookup::isVisibleFrom(prop, *context.scope)) {
                context.addDiag(diag::ClassPrivateMembersBitstream, sourceRange) << type;
                return false;
            }
        }
    }
    return true;
}